

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

void Gia_ManFindUnatePairsInt
               (word *pOff,word *pOn,Vec_Int_t *vBinate,Vec_Ptr_t *vDivs,int nWords,
               Vec_Int_t *vUnatePairs)

{
  int i;
  int iVar1;
  int iVar2;
  int i_00;
  uint uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  void *pvVar7;
  uint uVar8;
  int i_01;
  uint c;
  int i_02;
  uint c_00;
  int in_stack_ffffffffffffff78;
  
  iVar1 = vBinate->nSize;
  i_01 = 0;
  if (iVar1 < 1) {
    iVar1 = 0;
  }
  for (; i_01 != iVar1; i_01 = i_01 + 1) {
    iVar2 = Vec_IntEntry(vBinate,i_01);
    for (i_02 = 0; i_02 != i_01; i_02 = i_02 + 1) {
      i_00 = Vec_IntEntry(vBinate,i_02);
      i = iVar2;
      if (i_00 < iVar2) {
        i = i_00;
      }
      if (i_00 <= iVar2) {
        i_00 = iVar2;
      }
      pvVar6 = Vec_PtrEntry(vDivs,i);
      pvVar7 = Vec_PtrEntry(vDivs,i_00);
      for (uVar8 = 0; uVar8 != 4; uVar8 = uVar8 + 1) {
        c = uVar8 & 1;
        uVar3 = Abc_Var2Lit(i,c);
        c_00 = uVar8 >> 1;
        iVar4 = Abc_Var2Lit(i_00,c_00);
        iVar5 = Abc_TtIntersectTwo(pOff,(int)pvVar7,(word *)(ulong)c_00,(int)pvVar6,(word *)(ulong)c
                                   ,nWords,in_stack_ffffffffffffff78);
        if ((iVar5 == 0) &&
           (iVar5 = Abc_TtIntersectTwo(pOn,(int)pvVar7,(word *)(ulong)c_00,(int)pvVar6,
                                       (word *)(ulong)c,nWords,in_stack_ffffffffffffff78),
           iVar5 != 0)) {
          iVar4 = Abc_Var2Lit(iVar4 << 0xf | uVar3,0);
          Vec_IntPush(vUnatePairs,iVar4);
        }
      }
    }
  }
  return;
}

Assistant:

void Gia_ManFindUnatePairsInt( word * pOff, word * pOn, Vec_Int_t * vBinate, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnatePairs )
{
    int n, i, k, iDiv0_, iDiv1_;
    int Limit2 = Vec_IntSize(vBinate);//Abc_MinInt( Vec_IntSize(vBinate), 100 );
    Vec_IntForEachEntryStop( vBinate, iDiv1_, i, Limit2 )
    Vec_IntForEachEntryStop( vBinate, iDiv0_, k, i )
    {
        int iDiv0 = Abc_MinInt( iDiv0_, iDiv1_ );
        int iDiv1 = Abc_MaxInt( iDiv0_, iDiv1_ );
        word * pDiv0 = (word *)Vec_PtrEntry(vDivs, iDiv0);
        word * pDiv1 = (word *)Vec_PtrEntry(vDivs, iDiv1);
        for ( n = 0; n < 4; n++ )
        {
            int iLit0 = Abc_Var2Lit( iDiv0, n&1 );
            int iLit1 = Abc_Var2Lit( iDiv1, n>>1 );
            //if ( !Abc_TtIntersectTwo( pOff, 0, pDiv1, n>>1, pDiv0, n&1, nWords ) )
            if ( !Abc_TtIntersectTwo( pOff, 0, pDiv1, n>>1, pDiv0, n&1, nWords ) && Abc_TtIntersectTwo( pOn, 0, pDiv1, n>>1, pDiv0, n&1, nWords ) )
                Vec_IntPush( vUnatePairs, Abc_Var2Lit((iLit1 << 15) | iLit0, 0) );
        }
    }
}